

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int marktime(int *status)

{
  int *in_RDI;
  timeval tv;
  timeval local_18;
  int *local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  startsec = local_18.tv_sec;
  startmilli = (int)(local_18.tv_usec / 1000);
  scpu = clock();
  return *local_8;
}

Assistant:

int marktime(int *status)
{
#if defined(unix) || defined(__unix__)  || defined(__unix)
        struct  timeval tv;
/*        struct  timezone tz; */

/*        gettimeofday (&tv, &tz); */
        gettimeofday (&tv, NULL);

	startsec = tv.tv_sec;
        startmilli = tv.tv_usec/1000;

        scpu = clock();
#else
/* don't support high timing precision on Windows machines */
     	startsec = 0;
        startmilli = 0;

        scpu = clock();
#endif
	return( *status );
}